

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>_> *this,LogicalExpr condition,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> then_expr,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> else_expr)

{
  Impl *pIVar1;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> BVar2;
  Impl *in_RCX;
  Impl *in_RDX;
  BasicExprFactory<std::allocator<char>_> *in_RSI;
  Impl *impl;
  Impl *in_stack_ffffffffffffffc8;
  
  pIVar1 = Allocate<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
                     (in_RSI,(Kind)((ulong)in_RDX >> 0x20),(int)in_RDX);
  pIVar1->condition = (Impl *)in_RSI;
  pIVar1->then_expr = in_RDX;
  pIVar1->else_expr = in_RCX;
  BVar2 = internal::ExprBase::
          Create<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
                    (in_stack_ffffffffffffffc8);
  return (BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>)
         BVar2.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_;
}

Assistant:

ExprType MakeIf(LogicalExpr condition, Arg then_expr, Arg else_expr) {
    /// else_expr can be null.
    MP_ASSERT(condition != 0 && then_expr != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(ExprType::KIND);
    impl->condition = condition.impl_;
    impl->then_expr = then_expr.impl_;
    impl->else_expr = else_expr.impl_;
    return Expr::Create<ExprType>(impl);
  }